

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gd.cc
# Opt level: O1

void GD::save_load_online_state<sparse_parameters>
               (vw *all,io_buf *model_file,bool read,bool text,gd *g,stringstream *msg,
               sparse_parameters *weights)

{
  stringstream *psVar1;
  float fVar2;
  byte bVar3;
  size_t sVar4;
  weight *pwVar5;
  _Hash_node_base *p_Var6;
  ostream *poVar7;
  vw_exception *this;
  long lVar8;
  undefined7 in_register_00000011;
  size_t sVar9;
  uint uVar10;
  ulong *data;
  _Hash_node_base *p_Var11;
  uint64_t i;
  weight buff [4];
  undefined1 local_1fc [4];
  ulong local_1f8;
  stringstream *local_1f0;
  uint local_1e4;
  vw *local_1e0;
  string local_1d8;
  undefined8 local_1b8;
  undefined8 uStack_1b0;
  ostream local_1a8;
  
  local_1f0 = (stringstream *)(1L << ((byte)all->num_bits & 0x3f));
  local_1f8 = 0;
  local_1fc = (undefined1  [4])0x0;
  local_1e0 = all;
  if ((int)CONCAT71(in_register_00000011,read) == 0) {
    p_Var11 = (weights->_map)._M_h._M_before_begin._M_nxt;
    if (p_Var11 != (_Hash_node_base *)0x0) {
      psVar1 = msg + 0x10;
      uVar10 = (uint)text;
      local_1e4 = (uint)text;
      local_1f0 = msg;
      do {
        fVar2 = *(float *)&(p_Var11[2]._M_nxt)->_M_nxt;
        if ((fVar2 != 0.0) || (NAN(fVar2))) {
          local_1f8 = (ulong)p_Var11[1]._M_nxt >> ((byte)weights->_stride_shift & 0x3f);
          std::ostream::_M_insert<unsigned_long>((ulong)psVar1);
          if (local_1e0->num_bits < 0x1f) {
            local_1fc = (undefined1  [4])(uint)local_1f8;
            sVar4 = 4;
            data = (ulong *)local_1fc;
          }
          else {
            sVar4 = 8;
            data = &local_1f8;
          }
          bin_text_write_fixed(model_file,(char *)data,sVar4,msg,SUB41(uVar10,0));
          if (g == (gd *)0x0) {
LAB_001515e3:
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)psVar1,":",1);
            p_Var6 = p_Var11[2]._M_nxt;
            sVar4 = 4;
          }
          else {
            if (g->adaptive == false) {
              if (g->normalized == false) goto LAB_001515e3;
LAB_0015158a:
              if (g->normalized == true) goto LAB_00151590;
            }
            else {
              if (g->normalized != true) {
LAB_00151590:
                std::__ostream_insert<char,std::char_traits<char>>((ostream *)psVar1,":",1);
                poVar7 = std::ostream::_M_insert<double>
                                   ((double)*(float *)&(p_Var11[2]._M_nxt)->_M_nxt);
                std::__ostream_insert<char,std::char_traits<char>>(poVar7," ",1);
                p_Var6 = (_Hash_node_base *)((long)&(p_Var11[2]._M_nxt)->_M_nxt + 4);
                sVar4 = 8;
                goto LAB_00151681;
              }
              if (g->adaptive == false) goto LAB_0015158a;
            }
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)psVar1,":",1);
            poVar7 = std::ostream::_M_insert<double>((double)*(float *)&(p_Var11[2]._M_nxt)->_M_nxt)
            ;
            std::__ostream_insert<char,std::char_traits<char>>(poVar7," ",1);
            poVar7 = std::ostream::_M_insert<double>
                               ((double)*(float *)((long)&(p_Var11[2]._M_nxt)->_M_nxt + 4));
            std::__ostream_insert<char,std::char_traits<char>>(poVar7," ",1);
            p_Var6 = p_Var11[2]._M_nxt + 1;
            sVar4 = 0xc;
          }
LAB_00151681:
          poVar7 = std::ostream::_M_insert<double>((double)*(float *)&p_Var6->_M_nxt);
          std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\n",1);
          uVar10 = local_1e4;
          msg = local_1f0;
          bin_text_write_fixed
                    (model_file,(char *)p_Var11[2]._M_nxt,sVar4,local_1f0,SUB41(local_1e4,0));
        }
        p_Var11 = p_Var11->_M_nxt;
      } while (p_Var11 != (_Hash_node_base *)0x0);
    }
  }
  else {
    do {
      if (local_1e0->num_bits < 0x1f) {
        sVar4 = io_buf::bin_read_fixed(model_file,local_1fc,4,"");
        local_1f8 = (ulong)(uint)local_1fc;
      }
      else {
        sVar4 = io_buf::bin_read_fixed(model_file,(char *)&local_1f8,8,"");
      }
      if (sVar4 == 0) {
        return;
      }
      if (local_1f0 <= local_1f8) {
        std::__cxx11::stringstream::stringstream((stringstream *)&local_1b8);
        std::__ostream_insert<char,std::char_traits<char>>
                  (&local_1a8,"Model content is corrupted, weight vector index ",0x30);
        poVar7 = std::ostream::_M_insert<unsigned_long>((ulong)&local_1a8);
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar7," must be less than total vector length ",0x27);
        std::ostream::_M_insert<unsigned_long>((ulong)poVar7);
        this = (vw_exception *)__cxa_allocate_exception(0x38);
        std::__cxx11::stringbuf::str();
        VW::vw_exception::vw_exception
                  (this,
                   "/workspace/llm4binary/github/license_all_cmakelists_1510/LAIRLAB[P]vowpal_wabbit/vowpalwabbit/gd.cc"
                   ,0x314,&local_1d8);
        __cxa_throw(this,&VW::vw_exception::typeinfo,VW::vw_exception::~vw_exception);
      }
      local_1b8 = 0;
      uStack_1b0 = 0;
      sVar9 = 4;
      if (g != (gd *)0x0) {
        if (g->adaptive == false) {
          if (g->normalized == true) {
LAB_0015146c:
            sVar9 = 8;
            if (g->normalized == false) goto LAB_00151477;
          }
        }
        else {
          sVar9 = 8;
          if (g->normalized == true) {
            if (g->adaptive == false) goto LAB_0015146c;
LAB_00151477:
            sVar9 = 0xc;
          }
        }
      }
      sVar9 = io_buf::bin_read_fixed(model_file,(char *)&local_1b8,sVar9,"");
      bVar3 = (byte)weights->_stride_shift;
      pwVar5 = sparse_parameters::operator[](weights,local_1f8 << (bVar3 & 0x3f));
      lVar8 = 0;
      do {
        pwVar5[lVar8] = *(weight *)((long)&local_1b8 + lVar8 * 4);
        lVar8 = lVar8 + 1;
      } while (1L << (bVar3 & 0x3f) != lVar8);
    } while (sVar4 + sVar9 != 0);
  }
  return;
}

Assistant:

void save_load_online_state(vw& all, io_buf& model_file, bool read, bool text, gd* g, stringstream& msg, T& weights)
{
  uint64_t length = (uint64_t)1 << all.num_bits;

  uint64_t i = 0;
  uint32_t old_i = 0;
  size_t brw = 1;

  if (read)
    do
    {
      brw = 1;
      if (all.num_bits < 31)  // backwards compatible
      {
        brw = model_file.bin_read_fixed((char*)&old_i, sizeof(old_i), "");
        i = old_i;
      }
      else
        brw = model_file.bin_read_fixed((char*)&i, sizeof(i), "");
      if (brw > 0)
      {
        if (i >= length)
          THROW("Model content is corrupted, weight vector index " << i << " must be less than total vector length "
                                                                   << length);
        weight buff[4] = {0, 0, 0, 0};
        if (g == NULL || (!g->adaptive && !g->normalized))
          brw += model_file.bin_read_fixed((char*)buff, sizeof(buff[0]), "");
        else if ((g->adaptive && !g->normalized) || (!g->adaptive && g->normalized))
          brw += model_file.bin_read_fixed((char*)buff, sizeof(buff[0]) * 2, "");
        else  // adaptive and normalized
          brw += model_file.bin_read_fixed((char*)buff, sizeof(buff[0]) * 3, "");
        uint32_t stride = 1 << weights.stride_shift();
        weight* v = &weights.strided_index(i);
        for (size_t i = 0; i < stride; i++) v[i] = buff[i];
      }
    } while (brw > 0);
  else  // write binary or text
    for (typename T::iterator v = weights.begin(); v != weights.end(); ++v)
      if (*v != 0.)
      {
        i = v.index() >> weights.stride_shift();
        msg << i;
        if (all.num_bits < 31)
        {
          old_i = (uint32_t)i;
          brw = bin_text_write_fixed(model_file, (char*)&old_i, sizeof(old_i), msg, text);
        }
        else
          brw = bin_text_write_fixed(model_file, (char*)&i, sizeof(i), msg, text);

        if (g == nullptr || (!g->adaptive && !g->normalized))
        {
          msg << ":" << *v << "\n";
          brw += bin_text_write_fixed(model_file, (char*)&(*v), sizeof(*v), msg, text);
        }
        else if ((g->adaptive && !g->normalized) || (!g->adaptive && g->normalized))
        {
          // either adaptive or normalized
          msg << ":" << *v << " " << (&(*v))[1] << "\n";
          brw += bin_text_write_fixed(model_file, (char*)&(*v), 2 * sizeof(*v), msg, text);
        }
        else
        {
          // adaptive and normalized
          msg << ":" << *v << " " << (&(*v))[1] << " " << (&(*v))[2] << "\n";
          brw += bin_text_write_fixed(model_file, (char*)&(*v), 3 * sizeof(*v), msg, text);
        }
      }
}